

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COpenGLSLMaterialRenderer.cpp
# Opt level: O0

void __thiscall
irr::video::COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer
          (COpenGLSLMaterialRenderer *this,COpenGLDriver *driver,
          IShaderConstantSetCallBack *callback,E_MATERIAL_TYPE baseMaterial,s32 userData)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  pointer in_RSI;
  array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo> *in_RDI;
  undefined4 in_R8D;
  
  IReferenceCounted::IReferenceCounted((IReferenceCounted *)&in_RDI[2].is_sorted);
  IMaterialRenderer::IMaterialRenderer
            ((IMaterialRenderer *)in_RDI,&PTR_construction_vtable_24__0043d088);
  IMaterialRendererServices::IMaterialRendererServices
            ((IMaterialRendererServices *)
             &(in_RDI->m_data).
              super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  (in_RDI->m_data).
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x43cf58;
  *(undefined8 *)&in_RDI[2].is_sorted = 0x43d070;
  (in_RDI->m_data).
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)(vtable + 0xb8);
  (in_RDI->m_data).
  super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = in_RSI;
  *(undefined8 *)&in_RDI->is_sorted = in_RDX;
  *(undefined1 *)
   &in_RDI[1].m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_start = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].m_data.
           super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 1) = 0;
  *(undefined1 *)
   ((long)&in_RDI[1].m_data.
           super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 2) = 0;
  *(undefined4 *)
   ((long)&in_RDI[1].m_data.
           super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
           ._M_impl.super__Vector_impl_data._M_start + 4) = 0;
  *(undefined4 *)
   &in_RDI[1].m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_finish = 0;
  core::array<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>::array(in_RDI);
  *(undefined4 *)
   &in_RDI[2].m_data.
    super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = in_R8D;
  switch(in_ECX) {
  case 1:
  case 3:
    *(undefined1 *)
     &in_RDI[1].m_data.
      super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
      ._M_impl.super__Vector_impl_data._M_start = 1;
    break;
  case 2:
    *(undefined1 *)
     ((long)&in_RDI[1].m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + 2) = 1;
    break;
  case 4:
    *(undefined1 *)
     ((long)&in_RDI[1].m_data.
             super__Vector_base<irr::video::COpenGLSLMaterialRenderer::SUniformInfo,_std::allocator<irr::video::COpenGLSLMaterialRenderer::SUniformInfo>_>
             ._M_impl.super__Vector_impl_data._M_start + 1) = 1;
  }
  if (*(long *)&in_RDI->is_sorted != 0) {
    IReferenceCounted::grab
              ((IReferenceCounted *)
               ((long)*(long **)&in_RDI->is_sorted +
               *(long *)(**(long **)&in_RDI->is_sorted + -0x18)));
  }
  return;
}

Assistant:

COpenGLSLMaterialRenderer::COpenGLSLMaterialRenderer(COpenGLDriver *driver,
		IShaderConstantSetCallBack *callback,
		E_MATERIAL_TYPE baseMaterial, s32 userData) :
		Driver(driver),
		CallBack(callback), Alpha(false), Blending(false), AlphaTest(false), Program(0), Program2(0), UserData(userData)
{
	switch (baseMaterial) {
	case EMT_TRANSPARENT_VERTEX_ALPHA:
	case EMT_TRANSPARENT_ALPHA_CHANNEL:
		Alpha = true;
		break;
	case EMT_ONETEXTURE_BLEND:
		Blending = true;
		break;
	case EMT_TRANSPARENT_ALPHA_CHANNEL_REF:
		AlphaTest = true;
		break;
	default:
		break;
	}

	if (CallBack)
		CallBack->grab();
}